

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuTestLog.cpp
# Opt level: O0

void __thiscall
tcu::LogImage::LogImage
          (LogImage *this,string *name,string *description,Surface *surface,
          qpImageCompressionMode compression)

{
  qpImageCompressionMode compression_local;
  Surface *surface_local;
  string *description_local;
  string *name_local;
  LogImage *this_local;
  
  std::__cxx11::string::string((string *)this,(string *)name);
  std::__cxx11::string::string((string *)&this->m_description,(string *)description);
  Surface::getAccess(&this->m_access,surface);
  Vector<float,_4>::Vector(&this->m_scale,1.0,1.0,1.0,1.0);
  Vector<float,_4>::Vector(&this->m_bias,0.0,0.0,0.0,0.0);
  this->m_compression = compression;
  return;
}

Assistant:

LogImage::LogImage (const std::string& name, const std::string& description, const Surface& surface, qpImageCompressionMode compression)
	: m_name		(name)
	, m_description	(description)
	, m_access		(surface.getAccess())
	, m_scale		(1.0f, 1.0f, 1.0f, 1.0f)
	, m_bias		(0.0f, 0.0f, 0.0f, 0.0f)
	, m_compression	(compression)
{
}